

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

void __thiscall QPDFObjectHandle::coalesceContentStreams(QPDFObjectHandle *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  QPDFObjectHandle contents;
  QPDFObjectHandle new_contents;
  string local_88;
  QPDFObjectHandle local_68;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_58;
  QPDFObjectHandle local_48;
  QPDFObjectHandle local_38;
  
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"/Contents","");
  getKey(&local_68,(string *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  bVar3 = isStream(&local_68);
  if (!bVar3) {
    bVar3 = isArray(&local_68);
    if (bVar3) {
      local_88._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,
                 "coalesceContentStreams called on object  with no associated PDF file","");
      getQPDF(this,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      QPDF::newStream((QPDF *)&local_48);
      local_88._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"/Contents","");
      replaceKey(this,&local_88,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      peVar4 = (element_type *)operator_new(0x30);
      this_01._M_pi =
           local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      peVar2 = (this->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_00 = (this->super_BaseHandle).obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      if (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_68.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_68.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        }
      }
      peVar4->supports_retry = false;
      peVar4->_vptr_StreamDataProvider = (_func_int **)&PTR__CoalesceProvider_002f2ae8;
      peVar4[1]._vptr_StreamDataProvider = (_func_int **)peVar2;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&peVar4[1].supports_retry = this_00;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      peVar4[2]._vptr_StreamDataProvider =
           (_func_int **)
           local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&peVar4[2].supports_retry =
           local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_68.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_68.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        }
      }
      this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
      this_02->_M_use_count = 1;
      this_02->_M_weak_count = 1;
      this_02->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_002f2b88;
      this_02[1]._vptr__Sp_counted_base = (_func_int **)peVar4;
      if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_02->_M_use_count = this_02->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_02->_M_use_count = this_02->_M_use_count + 1;
      }
      local_58.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar4;
      local_58.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = this_02;
      local_88._M_string_length = (size_type)operator_new(0x70);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length)->_M_use_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length)->_M_weak_count = 1
      ;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length)->
      _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002efae8;
      *(undefined1 *)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._M_string_length + 0x40))->
        _vptr__Sp_counted_base = 2;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._M_string_length + 0x40))->
      _M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._M_string_length + 0x40))->
      _M_weak_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._M_string_length + 0x50))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._M_string_length + 0x50))->
      _M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._M_string_length + 0x50))->
      _M_weak_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._M_string_length + 0x60))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._M_string_length + 0x60))->
      _M_use_count = -1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._M_string_length + 0x60))->
      _M_weak_count = -1;
      local_88._M_dataplus._M_p = (pointer)(local_88._M_string_length + 0x10);
      local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
      (local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count = 1;
      (local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = 1;
      (local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_002efae8;
      *(undefined1 *)
       &local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi[4]._vptr__Sp_counted_base = 2;
      local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[4]._M_use_count = 0;
      local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[4]._M_weak_count = 0;
      local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
      local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[5]._M_use_count = 0;
      local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[5]._M_weak_count = 0;
      local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[6]._vptr__Sp_counted_base = (_func_int **)0x0;
      local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[6]._M_use_count = -1;
      local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[6]._M_weak_count = -1;
      local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               (local_38.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
      replaceStreamData(&local_48,&local_58,(QPDFObjectHandle *)&local_88,&local_38);
      if (local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_38.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
      }
      if (local_58.
          super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.
                   super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
      if (local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
    }
  }
  if (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void
QPDFObjectHandle::coalesceContentStreams()
{
    QPDFObjectHandle contents = this->getKey("/Contents");
    if (contents.isStream()) {
        QTC::TC("qpdf", "QPDFObjectHandle coalesce called on stream");
        return;
    } else if (!contents.isArray()) {
        // /Contents is optional for pages, and some very damaged files may have pages that are
        // invalid in other ways.
        return;
    }
    // Should not be possible for a page object to not have an owning PDF unless it was manually
    // constructed in some incorrect way. However, it can happen in a PDF file whose page structure
    // is direct, which is against spec but still possible to hand construct, as in fuzz issue
    // 27393.
    QPDF& qpdf = getQPDF("coalesceContentStreams called on object  with no associated PDF file");

    QPDFObjectHandle new_contents = newStream(&qpdf);
    this->replaceKey("/Contents", new_contents);

    auto provider = std::shared_ptr<StreamDataProvider>(new CoalesceProvider(*this, contents));
    new_contents.replaceStreamData(provider, newNull(), newNull());
}